

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

int lest::run(tests *specification,int argc,char **argv,ostream *os)

{
  int iVar1;
  allocator_type local_49;
  texts local_48;
  vector<lest::test,_std::allocator<lest::test>_> local_30;
  
  std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_30,specification);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,argv + 1
             ,argv + argc,&local_49);
  iVar1 = run(&local_30,&local_48,os);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_30);
  return iVar1;
}

Assistant:

inline int run( tests specification, int argc, char * argv[], std::ostream & os = std::cout )
{
    return run( specification, texts( argv + 1, argv + argc ), os  );
}